

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_string.cpp
# Opt level: O2

string * duckdb::ConvertToString::Operation<duckdb::string_t>(string_t input)

{
  string *in_RDI;
  string_t local_18;
  
  string_t::GetString_abi_cxx11_(in_RDI,&local_18);
  return in_RDI;
}

Assistant:

string ConvertToString::Operation(string_t input) {
	return input.GetString();
}